

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_management.c
# Opt level: O0

AMQP_MANAGEMENT_HANDLE amqp_management_create(SESSION_HANDLE session,char *management_node)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  size_t sVar3;
  AMQP_MANAGEMENT_HANDLE amqp_management_00;
  SINGLYLINKEDLIST_HANDLE pSVar4;
  AMQP_VALUE source_00;
  AMQP_VALUE target_00;
  char *name;
  char *name_00;
  LINK_HANDLE pLVar5;
  MESSAGE_SENDER_HANDLE pMVar6;
  MESSAGE_RECEIVER_HANDLE pMVar7;
  LOGGER_LOG l_13;
  LOGGER_LOG l_12;
  LOGGER_LOG l_11;
  LOGGER_LOG l_10;
  LOGGER_LOG l_9;
  char *receiver_link_name;
  LOGGER_LOG l_8;
  char *sender_link_name;
  size_t management_node_length;
  LOGGER_LOG l_7;
  AMQP_VALUE target;
  LOGGER_LOG l_6;
  AMQP_VALUE source;
  LOGGER_LOG l_5;
  LOGGER_LOG l_4;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  AMQP_MANAGEMENT_INSTANCE *amqp_management;
  char *management_node_local;
  SESSION_HANDLE session_local;
  
  if ((session == (SESSION_HANDLE)0x0) || (management_node == (char *)0x0)) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqp_management.c"
                ,"amqp_management_create",0x2f1,1,
                "Bad arguments: session = %p, management_node = %p",session,management_node);
    }
  }
  else {
    sVar3 = strlen(management_node);
    if (sVar3 == 0) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqp_management.c"
                  ,"amqp_management_create",0x2f7,1,"Empty string management node");
      }
    }
    else {
      amqp_management_00 = (AMQP_MANAGEMENT_HANDLE)calloc(1,0x70);
      if (amqp_management_00 == (AMQP_MANAGEMENT_HANDLE)0x0) {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqp_management.c"
                    ,"amqp_management_create",0x301,1,
                    "Cannot allocate memory for AMQP management handle");
        }
      }
      else {
        amqp_management_00->field_0x68 = amqp_management_00->field_0x68 & 0xfe;
        amqp_management_00->field_0x68 = amqp_management_00->field_0x68 & 0xfd;
        amqp_management_00->on_amqp_management_open_complete = (ON_AMQP_MANAGEMENT_OPEN_COMPLETE)0x0
        ;
        amqp_management_00->on_amqp_management_open_complete_context = (void *)0x0;
        amqp_management_00->on_amqp_management_error = (ON_AMQP_MANAGEMENT_ERROR)0x0;
        amqp_management_00->on_amqp_management_error_context = (void *)0x0;
        amqp_management_00->amqp_management_state = AMQP_MANAGEMENT_STATE_IDLE;
        amqp_management_00->status_code_key_name = (char *)0x0;
        amqp_management_00->status_description_key_name = (char *)0x0;
        pSVar4 = singlylinkedlist_create();
        amqp_management_00->pending_operations = pSVar4;
        if (amqp_management_00->pending_operations == (SINGLYLINKEDLIST_HANDLE)0x0) {
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 != (LOGGER_LOG)0x0) {
            (*p_Var2)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqp_management.c"
                      ,"amqp_management_create",0x314,1,"Cannot create pending operations list");
          }
        }
        else {
          iVar1 = internal_set_status_code_key_name(amqp_management_00,"statusCode");
          if (iVar1 == 0) {
            iVar1 = internal_set_status_description_key_name(amqp_management_00,"statusDescription")
            ;
            if (iVar1 == 0) {
              source_00 = messaging_create_source(management_node);
              if (source_00 == (AMQP_VALUE)0x0) {
                p_Var2 = xlogging_get_log_function();
                if (p_Var2 != (LOGGER_LOG)0x0) {
                  (*p_Var2)(AZ_LOG_ERROR,
                            "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqp_management.c"
                            ,"amqp_management_create",0x32b,1,"Failed creating source AMQP value");
                }
              }
              else {
                target_00 = messaging_create_target(management_node);
                if (target_00 == (AMQP_VALUE)0x0) {
                  p_Var2 = xlogging_get_log_function();
                  if (p_Var2 != (LOGGER_LOG)0x0) {
                    (*p_Var2)(AZ_LOG_ERROR,
                              "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqp_management.c"
                              ,"amqp_management_create",0x334,1,"Failed creating target AMQP value")
                    ;
                  }
                }
                else {
                  sVar3 = strlen(management_node);
                  name = (char *)malloc(sVar3 + 8);
                  if (name == (char *)0x0) {
                    p_Var2 = xlogging_get_log_function();
                    if (p_Var2 != (LOGGER_LOG)0x0) {
                      (*p_Var2)(AZ_LOG_ERROR,
                                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqp_management.c"
                                ,"amqp_management_create",0x33e,1,
                                "Failed allocating memory for sender link name");
                    }
                  }
                  else {
                    memcpy(name,management_node,sVar3);
                    *(char (*) [8])(name + sVar3) = (char  [8])0x7265646e65732d;
                    name_00 = (char *)malloc(sVar3 + 10);
                    if (name_00 == (char *)0x0) {
                      p_Var2 = xlogging_get_log_function();
                      if (p_Var2 != (LOGGER_LOG)0x0) {
                        (*p_Var2)(AZ_LOG_ERROR,
                                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqp_management.c"
                                  ,"amqp_management_create",0x34b,1,
                                  "Failed allocating memory for receiver link name");
                      }
                    }
                    else {
                      memcpy(name_00,management_node,sVar3);
                      builtin_strncpy(name_00 + sVar3,"-receiver",10);
                      pLVar5 = link_create(session,name,false,source_00,target_00);
                      amqp_management_00->sender_link = pLVar5;
                      if (amqp_management_00->sender_link == (LINK_HANDLE)0x0) {
                        p_Var2 = xlogging_get_log_function();
                        if (p_Var2 != (LOGGER_LOG)0x0) {
                          (*p_Var2)(AZ_LOG_ERROR,
                                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqp_management.c"
                                    ,"amqp_management_create",0x35c,1,"Failed creating sender link")
                          ;
                        }
                      }
                      else {
                        pLVar5 = link_create(session,name_00,true,source_00,target_00);
                        amqp_management_00->receiver_link = pLVar5;
                        if (amqp_management_00->receiver_link == (LINK_HANDLE)0x0) {
                          p_Var2 = xlogging_get_log_function();
                          if (p_Var2 != (LOGGER_LOG)0x0) {
                            (*p_Var2)(AZ_LOG_ERROR,
                                      "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqp_management.c"
                                      ,"amqp_management_create",0x36a,1,
                                      "Failed creating receiver link");
                          }
                        }
                        else {
                          pMVar6 = messagesender_create
                                             (amqp_management_00->sender_link,
                                              on_message_sender_state_changed,amqp_management_00);
                          amqp_management_00->message_sender = pMVar6;
                          if (amqp_management_00->message_sender == (MESSAGE_SENDER_HANDLE)0x0) {
                            p_Var2 = xlogging_get_log_function();
                            if (p_Var2 != (LOGGER_LOG)0x0) {
                              (*p_Var2)(AZ_LOG_ERROR,
                                        "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqp_management.c"
                                        ,"amqp_management_create",0x373,1,
                                        "Failed creating message sender");
                            }
                          }
                          else {
                            pMVar7 = messagereceiver_create
                                               (amqp_management_00->receiver_link,
                                                on_message_receiver_state_changed,amqp_management_00
                                               );
                            amqp_management_00->message_receiver = pMVar7;
                            if (amqp_management_00->message_receiver != (MESSAGE_RECEIVER_HANDLE)0x0
                               ) {
                              free(name_00);
                              free(name);
                              amqpvalue_destroy(target_00);
                              amqpvalue_destroy(source_00);
                              amqp_management_00->next_message_id = 0;
                              return amqp_management_00;
                            }
                            p_Var2 = xlogging_get_log_function();
                            if (p_Var2 != (LOGGER_LOG)0x0) {
                              (*p_Var2)(AZ_LOG_ERROR,
                                        "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqp_management.c"
                                        ,"amqp_management_create",0x37c,1,
                                        "Failed creating message receiver");
                            }
                            link_destroy(amqp_management_00->receiver_link);
                            messagesender_destroy(amqp_management_00->message_sender);
                          }
                          link_destroy(amqp_management_00->receiver_link);
                        }
                        link_destroy(amqp_management_00->sender_link);
                      }
                      free(name_00);
                    }
                    free(name);
                  }
                  amqpvalue_destroy(target_00);
                }
                amqpvalue_destroy(source_00);
              }
              free(amqp_management_00->status_description_key_name);
            }
            else {
              p_Var2 = xlogging_get_log_function();
              if (p_Var2 != (LOGGER_LOG)0x0) {
                (*p_Var2)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqp_management.c"
                          ,"amqp_management_create",0x322,1,"Cannot set status description key name"
                         );
              }
            }
            free(amqp_management_00->status_code_key_name);
          }
          else {
            p_Var2 = xlogging_get_log_function();
            if (p_Var2 != (LOGGER_LOG)0x0) {
              (*p_Var2)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqp_management.c"
                        ,"amqp_management_create",0x31b,1,"Cannot set status code key name");
            }
          }
          singlylinkedlist_destroy(amqp_management_00->pending_operations);
        }
        free(amqp_management_00);
      }
    }
  }
  return (AMQP_MANAGEMENT_HANDLE)0x0;
}

Assistant:

AMQP_MANAGEMENT_HANDLE amqp_management_create(SESSION_HANDLE session, const char* management_node)
{
    AMQP_MANAGEMENT_INSTANCE* amqp_management;

    if ((session == NULL) ||
        (management_node == NULL))
    {
        /* Codes_SRS_AMQP_MANAGEMENT_01_002: [ If `session` or `management_node` is NULL then `amqp_management_create` shall fail and return NULL. ]*/
        LogError("Bad arguments: session = %p, management_node = %p", session, management_node);
        amqp_management = NULL;
    }
    else if (strlen(management_node) == 0)
    {
        /* Codes_SRS_AMQP_MANAGEMENT_01_030: [ If `management_node` is an empty string, then `amqp_management_create` shall fail and return NULL. ]*/
        LogError("Empty string management node");
        amqp_management = NULL;
    }
    else
    {
        /* Codes_SRS_AMQP_MANAGEMENT_01_001: [ `amqp_management_create` shall create a new CBS instance and on success return a non-NULL handle to it. ]*/
        amqp_management = (AMQP_MANAGEMENT_INSTANCE*)calloc(1, sizeof(AMQP_MANAGEMENT_INSTANCE));
        if (amqp_management == NULL)
        {
            /* Codes_SRS_AMQP_MANAGEMENT_01_005: [ If allocating memory for the new handle fails, `amqp_management_create` shall fail and return NULL. ]*/
            LogError("Cannot allocate memory for AMQP management handle");
        }
        else
        {
            amqp_management->sender_connected = 0;
            amqp_management->receiver_connected = 0;
            amqp_management->on_amqp_management_open_complete = NULL;
            amqp_management->on_amqp_management_open_complete_context = NULL;
            amqp_management->on_amqp_management_error = NULL;
            amqp_management->on_amqp_management_error_context = NULL;
            amqp_management->amqp_management_state = AMQP_MANAGEMENT_STATE_IDLE;
            amqp_management->status_code_key_name = NULL;
            amqp_management->status_description_key_name = NULL;

            /* Codes_SRS_AMQP_MANAGEMENT_01_003: [ `amqp_management_create` shall create a singly linked list for pending operations by calling `singlylinkedlist_create`. ]*/
            amqp_management->pending_operations = singlylinkedlist_create();
            if (amqp_management->pending_operations == NULL)
            {
                /* Codes_SRS_AMQP_MANAGEMENT_01_004: [ If `singlylinkedlist_create` fails, `amqp_management_create` shall fail and return NULL. ]*/
                LogError("Cannot create pending operations list");
            }
            else
            {
                /* Codes_SRS_AMQP_MANAGEMENT_01_181: [ `amqp_management_create` shall set the status code key name to be used for parsing the status code to `statusCode`. ]*/
                if (internal_set_status_code_key_name(amqp_management, "statusCode") != 0)
                {
                    LogError("Cannot set status code key name");
                }
                else
                {
                    /* Codes_SRS_AMQP_MANAGEMENT_01_182: [ `amqp_management_create` shall set the status description key name to be used for parsing the status description to `statusDescription`. ]*/
                    if (internal_set_status_description_key_name(amqp_management, "statusDescription") != 0)
                    {
                        LogError("Cannot set status description key name");
                    }
                    else
                    {
                        /* Codes_SRS_AMQP_MANAGEMENT_01_010: [ The `source` argument shall be a value created by calling `messaging_create_source` with `management_node` as argument. ]*/
                        AMQP_VALUE source = messaging_create_source(management_node);
                        if (source == NULL)
                        {
                            /* Codes_SRS_AMQP_MANAGEMENT_01_012: [ If `messaging_create_source` fails then `amqp_management_create` shall fail and return NULL. ]*/
                            LogError("Failed creating source AMQP value");
                        }
                        else
                        {
                            /* Codes_SRS_AMQP_MANAGEMENT_01_011: [ The `target` argument shall be a value created by calling `messaging_create_target` with `management_node` as argument. ]*/
                            AMQP_VALUE target = messaging_create_target(management_node);
                            if (target == NULL)
                            {
                                /* Codes_SRS_AMQP_MANAGEMENT_01_013: [ If `messaging_create_target` fails then `amqp_management_create` shall fail and return NULL. ]*/
                                LogError("Failed creating target AMQP value");
                            }
                            else
                            {
                                size_t management_node_length = strlen(management_node);

                                char* sender_link_name = (char*)malloc(management_node_length + COUNT_CHARS(sender_suffix) + 1);
                                if (sender_link_name == NULL)
                                {
                                    /* Codes_SRS_AMQP_MANAGEMENT_01_033: [ If any other error occurs `amqp_management_create` shall fail and return NULL. ]*/
                                    LogError("Failed allocating memory for sender link name");
                                }
                                else
                                {
                                    char* receiver_link_name;

                                    (void)memcpy(sender_link_name, management_node, management_node_length);
                                    (void)memcpy(sender_link_name + management_node_length, sender_suffix, COUNT_CHARS(sender_suffix) + 1);

                                    receiver_link_name = (char*)malloc(management_node_length + COUNT_CHARS(receiver_suffix) + 1);
                                    if (receiver_link_name == NULL)
                                    {
                                        /* Codes_SRS_AMQP_MANAGEMENT_01_033: [ If any other error occurs `amqp_management_create` shall fail and return NULL. ]*/
                                        LogError("Failed allocating memory for receiver link name");
                                    }
                                    else
                                    {
                                        (void)memcpy(receiver_link_name, management_node, management_node_length);
                                        (void)memcpy(receiver_link_name + management_node_length, receiver_suffix, COUNT_CHARS(receiver_suffix) + 1);

                                        /* Codes_SRS_AMQP_MANAGEMENT_01_006: [ `amqp_management_create` shall create a sender link by calling `link_create`. ]*/
                                        /* Codes_SRS_AMQP_MANAGEMENT_01_007: [ The `session` argument shall be set to `session`. ]*/
                                        /* Codes_SRS_AMQP_MANAGEMENT_01_008: [ The `name` argument shall be constructed by concatenating the `management_node` value with `-sender`. ]*/
                                        /* Codes_SRS_AMQP_MANAGEMENT_01_009: [ The `role` argument shall be `role_sender`. ]*/
                                        /* Codes_SRS_AMQP_MANAGEMENT_01_019: [ The `source` argument shall be the value created by calling `messaging_create_source`. ]*/
                                        /* Codes_SRS_AMQP_MANAGEMENT_01_020: [ The `target` argument shall be the value created by calling `messaging_create_target`. ]*/
                                        amqp_management->sender_link = link_create(session, sender_link_name, role_sender, source, target);
                                        if (amqp_management->sender_link == NULL)
                                        {
                                            /* Codes_SRS_AMQP_MANAGEMENT_01_014: [ If `link_create` fails when creating the sender link then `amqp_management_create` shall fail and return NULL. ]*/
                                            LogError("Failed creating sender link");
                                        }
                                        else
                                        {
                                            /* Codes_SRS_AMQP_MANAGEMENT_01_015: [ `amqp_management_create` shall create a receiver link by calling `link_create`. ]*/
                                            /* Codes_SRS_AMQP_MANAGEMENT_01_016: [ The `session` argument shall be set to `session`. ]*/
                                            /* Codes_SRS_AMQP_MANAGEMENT_01_017: [ The `name` argument shall be constructed by concatenating the `management_node` value with `-receiver`. ]*/
                                            /* Codes_SRS_AMQP_MANAGEMENT_01_018: [ The `role` argument shall be `role_receiver`. ]*/
                                            /* Codes_SRS_AMQP_MANAGEMENT_01_019: [ The `source` argument shall be the value created by calling `messaging_create_source`. ]*/
                                            /* Codes_SRS_AMQP_MANAGEMENT_01_020: [ The `target` argument shall be the value created by calling `messaging_create_target`. ]*/
                                            amqp_management->receiver_link = link_create(session, receiver_link_name, role_receiver, source, target);
                                            if (amqp_management->receiver_link == NULL)
                                            {
                                                /* Codes_SRS_AMQP_MANAGEMENT_01_021: [ If `link_create` fails when creating the receiver link then `amqp_management_create` shall fail and return NULL. ]*/
                                                LogError("Failed creating receiver link");
                                            }
                                            else
                                            {
                                                /* Codes_SRS_AMQP_MANAGEMENT_01_022: [ `amqp_management_create` shall create a message sender by calling `messagesender_create` and passing to it the sender link handle. ]*/
                                                amqp_management->message_sender = messagesender_create(amqp_management->sender_link, on_message_sender_state_changed, amqp_management);
                                                if (amqp_management->message_sender == NULL)
                                                {
                                                    /* Codes_SRS_AMQP_MANAGEMENT_01_031: [ If `messagesender_create` fails then `amqp_management_create` shall fail and return NULL. ]*/
                                                    LogError("Failed creating message sender");
                                                }
                                                else
                                                {
                                                    /* Codes_SRS_AMQP_MANAGEMENT_01_023: [ `amqp_management_create` shall create a message receiver by calling `messagereceiver_create` and passing to it the receiver link handle. ]*/
                                                    amqp_management->message_receiver = messagereceiver_create(amqp_management->receiver_link, on_message_receiver_state_changed, amqp_management);
                                                    if (amqp_management->message_receiver == NULL)
                                                    {
                                                        /* Codes_SRS_AMQP_MANAGEMENT_01_032: [ If `messagereceiver_create` fails then `amqp_management_create` shall fail and return NULL. ]*/
                                                        LogError("Failed creating message receiver");
                                                        link_destroy(amqp_management->receiver_link);
                                                    }
                                                    else
                                                    {
                                                        free(receiver_link_name);
                                                        free(sender_link_name);
                                                        amqpvalue_destroy(target);
                                                        amqpvalue_destroy(source);

                                                        /* Codes_SRS_AMQP_MANAGEMENT_01_106: [ The message Id set on the message properties shall start at 0. ]*/
                                                        amqp_management->next_message_id = 0;

                                                        goto all_ok;
                                                    }

                                                    messagesender_destroy(amqp_management->message_sender);
                                                }

                                                link_destroy(amqp_management->receiver_link);
                                            }

                                            link_destroy(amqp_management->sender_link);
                                        }

                                        free(receiver_link_name);
                                    }

                                    free(sender_link_name);
                                }

                                amqpvalue_destroy(target);
                            }

                            amqpvalue_destroy(source);
                        }

                        free(amqp_management->status_description_key_name);
                    }

                    free(amqp_management->status_code_key_name);
                }

                singlylinkedlist_destroy(amqp_management->pending_operations);
            }

            free(amqp_management);
            amqp_management = NULL;
        }
    }

all_ok:
    /* Codes_SRS_AMQP_MANAGEMENT_01_056: [ On success it shall return an ASYNC_OPERATION_HANDLE. ] */
    return amqp_management;
}